

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Renderbuffers::GetParameterErrorsTest::PrepareObjects
          (GetParameterErrorsTest *this)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  uint local_20;
  GLuint i;
  bool is_parameter;
  Functions *gl;
  GetParameterErrorsTest *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar7 + 0x6e8))(1,&this->m_rbo_valid);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2585);
  (**(code **)(lVar7 + 0xa0))(0x8d41,this->m_rbo_valid);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2588);
  bVar2 = true;
  while (bVar2) {
    bVar2 = false;
    this->m_parameter_invalid = this->m_parameter_invalid + 1;
    for (local_20 = 0; local_20 < 10; local_20 = local_20 + 1) {
      if (PrepareObjects::valid_parameters[local_20] == this->m_parameter_invalid) {
        bVar2 = true;
      }
    }
  }
  do {
    pcVar1 = *(code **)(lVar7 + 0xca8);
    this->m_rbo_invalid = this->m_rbo_invalid + 1;
    cVar3 = (*pcVar1)();
  } while (cVar3 != '\0');
  return;
}

Assistant:

void GetParameterErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid objects. */
	gl.genRenderbuffers(1, &m_rbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Invalid parameter. */
	bool is_parameter = true;

	while (is_parameter)
	{
		is_parameter = false;

		++m_parameter_invalid;

		static const glw::GLenum valid_parameters[] = { GL_RENDERBUFFER_WIDTH,			 GL_RENDERBUFFER_HEIGHT,
														GL_RENDERBUFFER_INTERNAL_FORMAT, GL_RENDERBUFFER_SAMPLES,
														GL_RENDERBUFFER_RED_SIZE,		 GL_RENDERBUFFER_GREEN_SIZE,
														GL_RENDERBUFFER_BLUE_SIZE,		 GL_RENDERBUFFER_ALPHA_SIZE,
														GL_RENDERBUFFER_DEPTH_SIZE,		 GL_RENDERBUFFER_STENCIL_SIZE };

		static const glw::GLuint valid_parameters_count = sizeof(valid_parameters) / sizeof(valid_parameters[0]);

		for (glw::GLuint i = 0; i < valid_parameters_count; ++i)
		{
			if (valid_parameters[i] == m_parameter_invalid)
			{
				is_parameter = true;
			}
		}
	}

	/* Invalid objects. */
	while (gl.isRenderbuffer(++m_rbo_invalid))
		;
}